

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O1

IPAsKeyLRU * __thiscall
BinHash<IPAsKeyLRU>::DoInsert
          (BinHash<IPAsKeyLRU> *this,IPAsKeyLRU *key,bool need_alloc,bool *stored)

{
  uint uVar1;
  size_t sVar2;
  size_t __n;
  IPAsKeyLRU **ppIVar3;
  ulong uVar4;
  int iVar5;
  undefined4 extraout_var;
  size_t sVar6;
  uint32_t uVar7;
  IPAsKeyLRU *pIVar8;
  
  *stored = false;
  uVar1 = this->tableSize;
  if (uVar1 != 0 && key != (IPAsKeyLRU *)0x0) {
    if ((key->super_IPAsKey).hash == 0) {
      (key->super_IPAsKey).hash = 0xdeadbeef;
      sVar2 = (key->super_IPAsKey).addr_len;
      if (sVar2 != 0) {
        uVar7 = 0xdeadbeef;
        sVar6 = 0;
        do {
          uVar7 = (uint)(key->super_IPAsKey).addr[sVar6] + uVar7 * 0x65;
          (key->super_IPAsKey).hash = uVar7;
          sVar6 = sVar6 + 1;
        } while (sVar2 != sVar6);
      }
    }
    uVar4 = (ulong)(key->super_IPAsKey).hash % (ulong)uVar1;
    pIVar8 = this->hashBin[uVar4];
    if (pIVar8 != (IPAsKeyLRU *)0x0) {
      __n = (key->super_IPAsKey).addr_len;
      do {
        if (((pIVar8->super_IPAsKey).addr_len == __n) &&
           (iVar5 = bcmp((pIVar8->super_IPAsKey).addr,(key->super_IPAsKey).addr,__n), iVar5 == 0)) {
          (*(pIVar8->super_IPAsKey)._vptr_IPAsKey[3])(pIVar8,key);
          *stored = false;
          return pIVar8;
        }
        pIVar8 = pIVar8->HashNext;
      } while (pIVar8 != (IPAsKeyLRU *)0x0);
    }
    if (need_alloc) {
      iVar5 = (*(key->super_IPAsKey)._vptr_IPAsKey[2])(key);
      key = (IPAsKeyLRU *)CONCAT44(extraout_var,iVar5);
    }
    if (key != (IPAsKeyLRU *)0x0) {
      ppIVar3 = this->hashBin;
      key->HashNext = ppIVar3[uVar4];
      ppIVar3[uVar4] = key;
      *stored = true;
      this->tableCount = this->tableCount + 1;
      return key;
    }
  }
  return (IPAsKeyLRU *)0x0;
}

Assistant:

KeyObj * DoInsert(KeyObj * key, bool need_alloc, bool * stored)
    {
        KeyObj * retKey = NULL;

        *stored = false;

        if (key != NULL && tableSize > 0)
        {
            uint32_t hash_index = key->Hash() % tableSize;
            KeyObj * oldKey = hashBin[hash_index];

            while (oldKey != NULL && !key->IsSameKey(oldKey))
            {
                oldKey = oldKey->HashNext;
            }

            if (oldKey != NULL)
            {
                /* the keyed object is already in the table*/
                oldKey->Add(key);
                retKey = oldKey;
                *stored = false;
            }
            else
            {
                retKey = key;

                if (need_alloc)
                {
                    retKey = key->CreateCopy();
                }

                if (retKey != NULL)
                {
                    retKey->HashNext = hashBin[hash_index];
                    hashBin[hash_index] = retKey;
                    *stored = true;
                    tableCount++;
                }
            }
        }

        return retKey;
    }